

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetFilePostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  cmValue cVar5;
  string *psVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string frameworkPostfix;
  string configProp;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_b0,config);
    local_50._M_dataplus._M_p = (pointer)local_b0._M_string_length;
    local_50._M_string_length = (size_type)local_b0._M_dataplus._M_p;
    local_50.field_2._M_allocated_capacity = 8;
    local_50.field_2._8_8_ = (long)"FRAMEWORK_MULTI_CONFIG_POSTFIX" + 0x16;
    views._M_len = 2;
    views._M_array = (iterator)&local_50;
    cmCatViews_abi_cxx11_(&local_70,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    cVar5 = GetProperty(this,&local_70);
    bVar4 = cmTarget::IsImported(this->Target);
    if (!bVar4) {
      if (cVar5.Value != (string *)0x0) {
        bVar4 = IsAppBundleOnApple(this);
        if (!bVar4) {
          bVar4 = IsFrameworkOnApple(this);
          if (!bVar4) goto LAB_003c4c25;
        }
      }
      cVar5.Value = (string *)0x0;
    }
LAB_003c4c25:
    GetFrameworkMultiConfigPostfix(&local_50,this,config);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar3 = local_90._M_string_length;
    psVar6 = &local_90;
    if (local_90._M_string_length == 0) {
      psVar6 = cVar5.Value;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (psVar6 != (string *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      psVar6 = &local_90;
      if (sVar3 == 0) {
        psVar6 = cVar5.Value;
      }
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar6->_M_string_length);
      goto LAB_003c4cc9;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003c4cc9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePostfix(const std::string& config) const
{
  cmValue postfix = nullptr;
  std::string frameworkPostfix;
  if (!config.empty()) {
    std::string configProp =
      cmStrCat(cmSystemTools::UpperCase(config), "_POSTFIX");
    postfix = this->GetProperty(configProp);

    // Mac application bundles and frameworks have no regular postfix like
    // libraries do.
    if (!this->IsImported() && postfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      postfix = nullptr;
    }

    // Frameworks created by multi config generators can have a special
    // framework postfix.
    frameworkPostfix = this->GetFrameworkMultiConfigPostfix(config);
    if (!frameworkPostfix.empty()) {
      postfix = cmValue(frameworkPostfix);
    }
  }
  return postfix ? *postfix : std::string();
}